

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

void ZSTDMT_updateCParams_whileCompressing(ZSTDMT_CCtx *mtctx,ZSTD_CCtx_params *cctxParams)

{
  uint uVar1;
  ZSTD_compressionParameters cParams;
  
  uVar1 = (mtctx->params).cParams.windowLog;
  (mtctx->params).compressionLevel = cctxParams->compressionLevel;
  ZSTD_getCParamsFromCCtxParams(&cParams,cctxParams,0xffffffffffffffff,0,ZSTD_cpm_noAttachDict);
  (mtctx->params).cParams.searchLog = cParams.searchLog;
  (mtctx->params).cParams.minMatch = cParams.minMatch;
  (mtctx->params).cParams.targetLength = cParams.targetLength;
  (mtctx->params).cParams.strategy = cParams.strategy;
  (mtctx->params).cParams.windowLog = uVar1;
  (mtctx->params).cParams.chainLog = cParams.chainLog;
  (mtctx->params).cParams.hashLog = cParams.hashLog;
  (mtctx->params).cParams.searchLog = cParams.searchLog;
  return;
}

Assistant:

void ZSTDMT_updateCParams_whileCompressing(ZSTDMT_CCtx* mtctx, const ZSTD_CCtx_params* cctxParams)
{
    U32 const saved_wlog = mtctx->params.cParams.windowLog;   /* Do not modify windowLog while compressing */
    int const compressionLevel = cctxParams->compressionLevel;
    DEBUGLOG(5, "ZSTDMT_updateCParams_whileCompressing (level:%i)",
                compressionLevel);
    mtctx->params.compressionLevel = compressionLevel;
    {   ZSTD_compressionParameters cParams = ZSTD_getCParamsFromCCtxParams(cctxParams, ZSTD_CONTENTSIZE_UNKNOWN, 0, ZSTD_cpm_noAttachDict);
        cParams.windowLog = saved_wlog;
        mtctx->params.cParams = cParams;
    }
}